

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

bool __thiscall
helics::FederateState::checkAndSetValue
          (FederateState *this,InterfaceHandle pub_id,char *data,uint64_t len)

{
  byte bVar1;
  PublicationInfo *len_00;
  PublicationInfo *in_RCX;
  Time in_RDX;
  undefined4 in_ESI;
  lock_guard<helics::FederateState> *in_RDI;
  bool res;
  PublicationInfo *pub;
  lock_guard<helics::FederateState> plock;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  InterfaceHandle handle;
  char *in_stack_ffffffffffffffd8;
  
  handle.hid = (BaseType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  std::lock_guard<helics::FederateState>::lock_guard
            (in_RDI,(mutex_type *)
                    CONCAT17(in_stack_ffffffffffffff9f,
                             CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
  len_00 = InterfaceInfo::getPublication
                     ((InterfaceInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),handle);
  bVar1 = PublicationInfo::CheckSetValue
                    (in_RCX,in_stack_ffffffffffffffd8,(uint64_t)len_00,in_RDX,
                     SUB41((uint)in_ESI >> 0x18,0));
  std::lock_guard<helics::FederateState>::~lock_guard((lock_guard<helics::FederateState> *)0x4bdd1b)
  ;
  return (bool)(bVar1 & 1);
}

Assistant:

bool FederateState::checkAndSetValue(InterfaceHandle pub_id, const char* data, uint64_t len)
{
    const std::lock_guard<FederateState> plock(*this);
    // this function could be called externally in a multi-threaded context
    auto* pub = interfaceInformation.getPublication(pub_id);
    auto res = pub->CheckSetValue(data, len, time_granted, only_transmit_on_change);
    return res;
}